

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_OFFReader_::read_binary
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt,bool param_4)

{
  Options *pOVar1;
  BaseImporter *pBVar2;
  bool bVar3;
  reference pvVar4;
  float *pfVar5;
  int *piVar6;
  byte local_161;
  VectorT<unsigned_char,_3> local_14f;
  undefined4 local_14c;
  VectorT<unsigned_char,_4> local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  VertexHandle local_134;
  FaceHandle fh;
  BaseHandle local_12c;
  BaseHandle local_128;
  int local_124;
  VectorT<unsigned_char,_3> local_11f;
  int local_11c;
  VectorT<unsigned_char,_4> local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  string local_100 [8];
  string header;
  BaseHandle local_cc;
  undefined1 local_c8 [4];
  VertexHandle vh;
  VHandles vhandles;
  Vec2f t;
  Vec4f cAf;
  undefined1 local_8c [8];
  Vec3f cf;
  Vec4i cA;
  Vec3i c;
  Vec3f n;
  Vec3f v;
  uint dummy;
  uint nF;
  uint nV;
  uint idx;
  uint l;
  uint k;
  uint j;
  uint i;
  bool param_4_local;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _OFFReader_ *this_local;
  
  j._3_1_ = param_4;
  _i = _opt;
  _opt_local = (Options *)_bi;
  _bi_local = (BaseImporter *)_in;
  _in_local = (istream *)this;
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1));
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)(c.super_VectorDataT<int,_3>.values_ + 1));
  VectorT<int,_3>::VectorT((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2));
  VectorT<int,_4>::VectorT((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1));
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)local_8c);
  VectorT<float,_4>::VectorT((VectorT<float,_4> *)&t);
  VectorT<float,_2>::VectorT
            ((VectorT<float,_2> *)
             &vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c8);
  VertexHandle::VertexHandle((VertexHandle *)&local_cc,-1);
  std::__cxx11::string::string(local_100);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)_bi_local,local_100);
  readValue(this,(istream *)_bi_local,&dummy);
  readValue(this,(istream *)_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 2));
  readValue(this,(istream *)_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 1));
  (**(code **)(*(long *)_opt_local + 0xd8))
            (_opt_local,dummy,dummy * 3,v.super_VectorDataT<float,_3>.values_[2]);
  k = 0;
  while( true ) {
    local_161 = 0;
    if (k < dummy) {
      local_161 = std::ios::eof();
      local_161 = local_161 ^ 0xff;
    }
    pBVar2 = _bi_local;
    if ((local_161 & 1) == 0) break;
    pfVar5 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
    readValue(this,(istream *)pBVar2,pfVar5);
    pBVar2 = _bi_local;
    pfVar5 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
    readValue(this,(istream *)pBVar2,pfVar5);
    pBVar2 = _bi_local;
    pfVar5 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
    readValue(this,(istream *)pBVar2,pfVar5);
    local_104 = (**(code **)(*(long *)_opt_local + 0x10))
                          (_opt_local,n.super_VectorDataT<float,_3>.values_ + 1);
    local_cc.idx_ = local_104;
    bVar3 = Options::vertex_has_normal(&this->options_);
    pBVar2 = _bi_local;
    if (bVar3) {
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(c.super_VectorDataT<int,_3>.values_ + 1),0);
      readValue(this,(istream *)pBVar2,pfVar5);
      pBVar2 = _bi_local;
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(c.super_VectorDataT<int,_3>.values_ + 1),1);
      readValue(this,(istream *)pBVar2,pfVar5);
      pBVar2 = _bi_local;
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(c.super_VectorDataT<int,_3>.values_ + 1),2);
      readValue(this,(istream *)pBVar2,pfVar5);
      bVar3 = Options::vertex_has_normal(&this->userOptions_);
      if (bVar3) {
        local_108 = local_cc.idx_;
        (**(code **)(*(long *)_opt_local + 0x40))
                  (_opt_local,local_cc.idx_,c.super_VectorDataT<int,_3>.values_ + 1);
      }
    }
    bVar3 = Options::vertex_has_color(&this->options_);
    if (bVar3) {
      bVar3 = Options::color_is_float(&this->userOptions_);
      if (bVar3) {
        Options::operator+=(_i,0x1000);
        bVar3 = Options::color_has_alpha(&this->options_);
        pBVar2 = _bi_local;
        if (bVar3) {
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,0);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,1);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,2);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,3);
          readValue(this,(istream *)pBVar2,pfVar5);
          bVar3 = Options::vertex_has_color(&this->userOptions_);
          if (bVar3) {
            local_10c = local_cc.idx_;
            (**(code **)(*(long *)_opt_local + 0x60))(_opt_local,local_cc.idx_,&t);
          }
        }
        else {
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,0);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,1);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,2);
          readValue(this,(istream *)pBVar2,pfVar5);
          bVar3 = Options::vertex_has_color(&this->userOptions_);
          if (bVar3) {
            local_110 = local_cc.idx_;
            (**(code **)(*(long *)_opt_local + 0x58))(_opt_local,local_cc.idx_,local_8c);
          }
        }
      }
      else {
        bVar3 = Options::color_has_alpha(&this->options_);
        pBVar2 = _bi_local;
        if (bVar3) {
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),0);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),1);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),2);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),3);
          readValue(this,(istream *)pBVar2,piVar6);
          bVar3 = Options::vertex_has_color(&this->userOptions_);
          pOVar1 = _opt_local;
          if (bVar3) {
            local_114 = local_cc.idx_;
            VectorT<unsigned_char,_4>::VectorT<int>
                      (&local_118,(VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1));
            (**(code **)(*(long *)pOVar1 + 0x50))(pOVar1,local_114,&local_118);
          }
        }
        else {
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),0);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),1);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),2);
          readValue(this,(istream *)pBVar2,piVar6);
          bVar3 = Options::vertex_has_color(&this->userOptions_);
          pOVar1 = _opt_local;
          if (bVar3) {
            local_11c = local_cc.idx_;
            VectorT<unsigned_char,_3>::VectorT<int>
                      (&local_11f,(VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2));
            (**(code **)(*(long *)pOVar1 + 0x48))(pOVar1,local_11c,&local_11f);
          }
        }
      }
    }
    bVar3 = Options::vertex_has_texcoord(&this->options_);
    pBVar2 = _bi_local;
    if (bVar3) {
      pfVar5 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)
                          &vhandles.
                           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      readValue(this,(istream *)pBVar2,pfVar5);
      pBVar2 = _bi_local;
      pfVar5 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)
                          &vhandles.
                           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      readValue(this,(istream *)pBVar2,pfVar5);
      bVar3 = Options::vertex_has_texcoord(&this->userOptions_);
      if (bVar3) {
        local_124 = local_cc.idx_;
        (**(code **)(*(long *)_opt_local + 0x68))
                  (_opt_local,local_cc.idx_,
                   &vhandles.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    k = k + 1;
  }
  for (k = 0; k < (uint)v.super_VectorDataT<float,_3>.values_[2]; k = k + 1) {
    readValue(this,(istream *)_bi_local,&dummy);
    if (dummy == 3) {
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c8
                 ,3);
      readValue(this,(istream *)_bi_local,&l);
      readValue(this,(istream *)_bi_local,&idx);
      readValue(this,(istream *)_bi_local,&nV);
      VertexHandle::VertexHandle((VertexHandle *)&local_128,l);
      pvVar4 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c8,0);
      (pvVar4->super_BaseHandle).idx_ = local_128.idx_;
      VertexHandle::VertexHandle((VertexHandle *)&local_12c,idx);
      pvVar4 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c8,1);
      (pvVar4->super_BaseHandle).idx_ = local_12c.idx_;
      VertexHandle::VertexHandle((VertexHandle *)&fh,nV);
      pvVar4 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c8,2);
      (pvVar4->super_BaseHandle).idx_ = (int)fh.super_BaseHandle.idx_;
    }
    else {
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::clear
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c8
                );
      for (l = 0; l < dummy; l = l + 1) {
        readValue(this,(istream *)_bi_local,&nF);
        VertexHandle::VertexHandle(&local_134,nF);
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::push_back
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   local_c8,&local_134);
      }
    }
    local_138 = (**(code **)(*(long *)_opt_local + 0x20))(_opt_local,local_c8);
    bVar3 = Options::face_has_color(_i);
    if (bVar3) {
      bVar3 = Options::color_is_float(&this->userOptions_);
      if (bVar3) {
        Options::operator+=(_i,0x1000);
        bVar3 = Options::color_has_alpha(&this->options_);
        pBVar2 = _bi_local;
        if (bVar3) {
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,0);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,1);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,2);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_4>::operator[]((VectorT<float,_4> *)&t,3);
          readValue(this,(istream *)pBVar2,pfVar5);
          bVar3 = Options::face_has_color(&this->userOptions_);
          if (bVar3) {
            local_13c = local_138;
            (**(code **)(*(long *)_opt_local + 0xb8))(_opt_local,local_138,&t);
          }
        }
        else {
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,0);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,1);
          readValue(this,(istream *)pBVar2,pfVar5);
          pBVar2 = _bi_local;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_8c,2);
          readValue(this,(istream *)pBVar2,pfVar5);
          bVar3 = Options::face_has_color(&this->userOptions_);
          if (bVar3) {
            local_140 = local_138;
            (**(code **)(*(long *)_opt_local + 0xb0))(_opt_local,local_138,local_8c);
          }
        }
      }
      else {
        bVar3 = Options::color_has_alpha(&this->options_);
        pBVar2 = _bi_local;
        if (bVar3) {
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),0);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),1);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),2);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_4>::operator[]
                             ((VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1),3);
          readValue(this,(istream *)pBVar2,piVar6);
          bVar3 = Options::face_has_color(&this->userOptions_);
          pOVar1 = _opt_local;
          if (bVar3) {
            local_144 = local_138;
            VectorT<unsigned_char,_4>::VectorT<int>
                      (&local_148,(VectorT<int,_4> *)(cf.super_VectorDataT<float,_3>.values_ + 1));
            (**(code **)(*(long *)pOVar1 + 0xa8))(pOVar1,local_144,&local_148);
          }
        }
        else {
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),0);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),1);
          readValue(this,(istream *)pBVar2,piVar6);
          pBVar2 = _bi_local;
          piVar6 = VectorT<int,_3>::operator[]
                             ((VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2),2);
          readValue(this,(istream *)pBVar2,piVar6);
          bVar3 = Options::face_has_color(&this->userOptions_);
          pOVar1 = _opt_local;
          if (bVar3) {
            local_14c = local_138;
            VectorT<unsigned_char,_3>::VectorT<int>
                      (&local_14f,(VectorT<int,_3> *)(cA.super_VectorDataT<int,_4>.values_ + 2));
            (**(code **)(*(long *)pOVar1 + 0xa0))(pOVar1,local_14c,&local_14f);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_100);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c8);
  return true;
}

Assistant:

bool
_OFFReader_::read_binary(std::istream& _in, BaseImporter& _bi, Options& _opt, bool /*_swap*/) const
{
  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec3i         c;
  OpenMesh::Vec4i         cA;
  OpenMesh::Vec3f         cf;
  OpenMesh::Vec4f         cAf;
  OpenMesh::Vec2f         t;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  readValue(_in, nV);
  readValue(_in, nF);
  readValue(_in, dummy);

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read Vertex
    readValue(_in, v[0]);
    readValue(_in, v[1]);
    readValue(_in, v[2]);

    vh = _bi.add_vertex(v);

    if ( options_.vertex_has_normal() ) {
      readValue(_in, n[0]);
      readValue(_in, n[1]);
      readValue(_in, n[2]);

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    if ( options_.vertex_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cAf );
        }else{

          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec3uc( c ) );
        }
      }
    }

    if ( options_.vertex_has_texcoord()) {
      readValue(_in, t[0]);
      readValue(_in, t[1]);

      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  // So far color spec is unsupported!
  for (i=0; i<nF; ++i)
  {
    readValue(_in, nV);

    if (nV == 3)
    {
      vhandles.resize(3);
      readValue(_in, j);
      readValue(_in, k);
      readValue(_in, l);

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    } else {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         readValue(_in, idx);
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //face color
    if ( _opt.face_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , cAf );
        }else{
          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, Vec3uc( c ) );
        }
      }
    }

  }

  // File was successfully parsed.
  return true;

}